

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  _func_int **pp_Var1;
  Expr *pEVar2;
  pointer pLVar3;
  Result RVar4;
  size_t sVar5;
  char *pcVar6;
  Expr *expr;
  LabelNode *label;
  Expr *local_38;
  LabelNode *local_30;
  
  if ((ulong)(((long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2)
  goto LAB_0011af09;
  RVar4 = TopLabelExpr(this,&local_30,&local_38);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_30->label_type) {
  case Block:
    if (local_38->type_ != Block) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0011af6e;
    }
    break;
  case Loop:
    if (local_38->type_ != Loop) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0011af6e;
    }
    break;
  case If:
    if (local_38->type_ != If) {
LAB_0011af42:
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0011af6e:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,pcVar6);
    }
    break;
  case Else:
    if (local_38->type_ != If) goto LAB_0011af42;
    pcVar6 = this->filename_;
    pp_Var1 = (_func_int **)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset
    ;
    sVar5 = strlen(pcVar6);
    *(size_t *)((long)&local_38[4].loc.field_1 + 8) = sVar5;
    *(char **)&local_38[4].type_ = pcVar6;
    local_38[5]._vptr_Expr = pp_Var1;
    local_38 = local_38 + 5;
    goto LAB_0011aef8;
  case Try:
    if (local_38->type_ != Try) {
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_0011af6e;
    }
    break;
  case TryTable:
    if (local_38->type_ != TryTable) {
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::TryTableExpr, Base = wabt::Expr]";
      goto LAB_0011af6e;
    }
    break;
  default:
    goto switchD_0011adef_default;
  }
  pp_Var1 = (_func_int **)this->filename_;
  pEVar2 = (Expr *)((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar5 = strlen((char *)pp_Var1);
  *(size_t *)&local_38[3].type_ = sVar5;
  local_38[4]._vptr_Expr = pp_Var1;
  local_38[4].super_intrusive_list_base<wabt::Expr>.next_ = pEVar2;
  local_38 = (Expr *)&local_38[4].super_intrusive_list_base<wabt::Expr>;
LAB_0011aef8:
  (local_38->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
switchD_0011adef_default:
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
LAB_0011af09:
  pLVar3 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    PrintError(this,"popping empty label stack");
    return (Result)Error;
  }
  (this->label_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLVar3 + -1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::TryTable:
        cast<TryTableExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}